

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall soplex::CLUFactor<double>::solveUpdateLeft(CLUFactor<double> *this,double *vec)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  iVar1 = (this->l).firstUpdate;
  iVar2 = (this->l).firstUnused;
  lVar8 = (long)iVar2;
  if (iVar1 < iVar2) {
    pdVar4 = (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->l).idx;
    piVar6 = (this->l).row;
    piVar7 = (this->l).start;
    do {
      iVar2 = piVar7[lVar8 + -1];
      iVar3 = piVar6[lVar8 + -1];
      dVar12 = -vec[iVar3];
      iVar9 = piVar7[lVar8];
      dVar11 = 0.0;
      if (iVar2 < iVar9) {
        lVar10 = (long)iVar2 * 4;
        dVar13 = dVar12;
        do {
          dVar14 = vec[*(int *)((long)piVar5 + lVar10)] * *(double *)((long)pdVar4 + lVar10 * 2);
          dVar12 = dVar13 + dVar14;
          dVar11 = dVar11 + (dVar14 - (dVar12 - dVar13)) + (dVar13 - (dVar12 - (dVar12 - dVar13)));
          iVar9 = iVar9 + -1;
          lVar10 = lVar10 + 4;
          dVar13 = dVar12;
        } while (iVar2 < iVar9);
      }
      lVar8 = lVar8 + -1;
      vec[iVar3] = -(dVar11 + dVar12);
    } while (iVar1 < lVar8);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUpdateLeft(R* vec)
{
   int i, j, k, end;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   assert(!l.updateType);               /* Forest-Tomlin Updates */

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      StableSum<R> tmp(-vec[lrow[i]]);

      for(j = lbeg[i + 1]; j > k; --j)
         tmp += vec[*idx++] * (*val++);

      vec[lrow[i]] = -R(tmp);
   }
}